

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdVerifyMessage(void *handle,char *signature,char *pubkey,char *message,char *magic,
                    char **recovered_pubkey)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  CfdException *pCVar5;
  int iVar6;
  Pubkey recoverable_pubkey;
  ByteData signature_obj;
  Pubkey pubkey_obj;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  void *local_80;
  Pubkey local_78;
  ByteData local_60;
  Pubkey local_48;
  
  local_80 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_c8._0_8_ = "cfdcapi_key.cpp";
    local_c8._8_4_ = 0x6b1;
    local_b8._M_allocated_capacity = 0x6204b8;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c8._0_8_ = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(message);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_c8,pubkey,(allocator *)&local_a0);
      cfd::core::Pubkey::Pubkey(&local_48,(string *)local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
      }
      cfd::core::ByteData::ByteData(&local_60);
      sVar3 = strnlen(signature,0x84);
      if (sVar3 == 0x82) {
        std::__cxx11::string::string((string *)local_c8,signature,(allocator *)&local_78);
        cfd::core::ByteData::ByteData((ByteData *)&local_a0,(string *)local_c8);
        cfd::core::ByteData::operator=(&local_60,(ByteData *)&local_a0);
      }
      else {
        std::__cxx11::string::string((string *)local_c8,signature,(allocator *)&local_78);
        cfd::core::CryptoUtil::DecodeBase64((ByteData *)&local_a0,(string *)local_c8);
        cfd::core::ByteData::operator=(&local_60,(ByteData *)&local_a0);
      }
      if (local_a0._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_a0._M_dataplus._M_p,
                        local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
      }
      cfd::core::Pubkey::Pubkey(&local_78);
      bVar1 = cfd::capi::IsEmptyString(magic);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_c8,message,(allocator *)&local_a0);
        bVar1 = cfd::core::Pubkey::VerifyBitcoinMessage
                          (&local_48,&local_60,(string *)local_c8,&local_78);
      }
      else {
        std::__cxx11::string::string((string *)local_c8,message,&local_a1);
        std::__cxx11::string::string((string *)&local_a0,magic,&local_a2);
        bVar1 = cfd::core::Pubkey::VerifyMessage
                          (&local_48,&local_60,(string *)local_c8,&local_a0,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
      }
      if (recovered_pubkey != (char **)0x0) {
        bVar2 = cfd::core::Pubkey::IsValid(&local_78);
        if (bVar2) {
          cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_c8,&local_78);
          pcVar4 = cfd::capi::CreateString((string *)local_c8);
          *recovered_pubkey = pcVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._0_8_ != &local_b8) {
            operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
          }
        }
      }
      iVar6 = 7;
      if (bVar1 != false) {
        iVar6 = 0;
      }
      if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return iVar6;
    }
    local_c8._0_8_ = "cfdcapi_key.cpp";
    local_c8._8_4_ = 0x6bd;
    local_b8._M_allocated_capacity = 0x6204b8;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"message is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c8._0_8_ = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Failed to parameter. message is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_c8._0_8_ = "cfdcapi_key.cpp";
  local_c8._8_4_ = 0x6b7;
  local_b8._M_allocated_capacity = 0x6204b8;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_c8._0_8_ = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyMessage(
    void* handle, const char* signature, const char* pubkey,
    const char* message, const char* magic, char** recovered_pubkey) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(message)) {
      warn(CFD_LOG_SOURCE, "message is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. message is null or empty.");
    }
    Pubkey pubkey_obj(pubkey);
    ByteData signature_obj;
    if (strnlen(signature, 132) == 130) {
      signature_obj = ByteData(signature);
    } else {
      signature_obj = CryptoUtil::DecodeBase64(signature);
    }

    Pubkey recoverable_pubkey;
    bool is_success = false;
    if (IsEmptyString(magic)) {
      is_success = pubkey_obj.VerifyBitcoinMessage(
          signature_obj, message, &recoverable_pubkey);
    } else {
      is_success = pubkey_obj.VerifyMessage(
          signature_obj, message, magic, &recoverable_pubkey);
    }
    if ((recovered_pubkey != nullptr) && recoverable_pubkey.IsValid()) {
      *recovered_pubkey = CreateString(recoverable_pubkey.GetHex());
    }

    if (!is_success) return CfdErrorCode::kCfdSignVerificationError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}